

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.cpp
# Opt level: O3

LUPMatrix * __thiscall
Matrix::GetLUPTransform(LUPMatrix *__return_storage_ptr__,Matrix *this,ChoiceType choice_type)

{
  bool bVar1;
  ostream *poVar2;
  LinearSystem transformer;
  Matrix MStack_178;
  LinearSystem local_158;
  
  if (this->n_ == this->m_) {
    Identity(&MStack_178,this->n_);
    LinearSystem::LinearSystem(&local_158,this,&MStack_178,LU);
    std::
    vector<std::vector<Fraction,_std::allocator<Fraction>_>,_std::allocator<std::vector<Fraction,_std::allocator<Fraction>_>_>_>
    ::~vector(&MStack_178.elements_);
    bVar1 = LinearSystem::RunDirectGauss(&local_158,choice_type);
    poVar2 = operator<<((ostream *)&Options::writer_abi_cxx11_,&local_158);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    if (bVar1) {
      LinearSystem::GetLUPMatrix(__return_storage_ptr__,&local_158);
    }
    else {
      (__return_storage_ptr__->column_permutation_).permutation_.
      super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
           (pointer)0x0;
      (__return_storage_ptr__->column_permutation_).permutation_.
      super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      (__return_storage_ptr__->row_permutation_).permutation_.
      super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      (__return_storage_ptr__->column_permutation_).permutation_.
      super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
           (pointer)0x0;
      (__return_storage_ptr__->row_permutation_).permutation_.
      super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
           (pointer)0x0;
      (__return_storage_ptr__->row_permutation_).permutation_.
      super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
           (pointer)0x0;
      (__return_storage_ptr__->u_).elements_.
      super__Vector_base<std::vector<Fraction,_std::allocator<Fraction>_>,_std::allocator<std::vector<Fraction,_std::allocator<Fraction>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      (__return_storage_ptr__->u_).elements_.
      super__Vector_base<std::vector<Fraction,_std::allocator<Fraction>_>,_std::allocator<std::vector<Fraction,_std::allocator<Fraction>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      (__return_storage_ptr__->u_).n_ = 0;
      (__return_storage_ptr__->u_).m_ = 0;
      (__return_storage_ptr__->u_).elements_.
      super__Vector_base<std::vector<Fraction,_std::allocator<Fraction>_>,_std::allocator<std::vector<Fraction,_std::allocator<Fraction>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      (__return_storage_ptr__->l_).elements_.
      super__Vector_base<std::vector<Fraction,_std::allocator<Fraction>_>,_std::allocator<std::vector<Fraction,_std::allocator<Fraction>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      (__return_storage_ptr__->l_).elements_.
      super__Vector_base<std::vector<Fraction,_std::allocator<Fraction>_>,_std::allocator<std::vector<Fraction,_std::allocator<Fraction>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      (__return_storage_ptr__->l_).n_ = 0;
      (__return_storage_ptr__->l_).m_ = 0;
      (__return_storage_ptr__->l_).elements_.
      super__Vector_base<std::vector<Fraction,_std::allocator<Fraction>_>,_std::allocator<std::vector<Fraction,_std::allocator<Fraction>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    }
    LinearSystem::~LinearSystem(&local_158);
    return __return_storage_ptr__;
  }
  __assert_fail("n_ == m_",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Nicksechko[P]Math/matrix.cpp"
                ,0x1bf,"LUPMatrix Matrix::GetLUPTransform(Options::ChoiceType) const");
}

Assistant:

LUPMatrix Matrix::GetLUPTransform(Options::ChoiceType choice_type) const {
  assert(n_ == m_);
  LinearSystem transformer(*this, Identity(n_), LinearSystem::Mode::LU);
  bool linear_independent = transformer.RunDirectGauss(choice_type);
  Options::writer << transformer << std::endl;
  if (!linear_independent) {
    return LUPMatrix();
  }

  return transformer.GetLUPMatrix();
}